

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O1

bool check_user_password(string *user_password,EncryptionData *data)

{
  bool bVar1;
  int iVar2;
  string u_value;
  string local_38;
  
  if (data->V < 5) {
    compute_U_value(&local_38,user_password,data);
    iVar2 = bcmp((data->U)._M_dataplus._M_p,local_38._M_dataplus._M_p,
                 (ulong)(data->R < 3) * 0x10 + 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    return iVar2 == 0;
  }
  bVar1 = check_user_password_V5(user_password,data);
  return bVar1;
}

Assistant:

static bool
check_user_password(std::string const& user_password, QPDF::EncryptionData const& data)
{
    if (data.getV() < 5) {
        return check_user_password_V4(user_password, data);
    } else {
        return check_user_password_V5(user_password, data);
    }
}